

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sptk_utils.cc
# Opt level: O3

bool sptk::WriteStream<double>
               (int write_point,int write_size,
               vector<double,_std::allocator<double>_> *sequence_to_write,ostream *output_stream,
               int *actual_write_size)

{
  pointer pdVar1;
  int iVar2;
  int iVar3;
  bool bVar4;
  
  if ((output_stream == (ostream *)0x0 || (write_size < 1 || write_point < 0)) ||
     (pdVar1 = (sequence_to_write->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start,
     (ulong)((long)(sequence_to_write->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_finish - (long)pdVar1 >> 3) <
     (ulong)(uint)(write_size + write_point))) {
    bVar4 = false;
  }
  else {
    if (actual_write_size == (int *)0x0) {
      std::ostream::write((char *)output_stream,(long)(pdVar1 + (uint)write_point));
    }
    else {
      iVar2 = std::ostream::tellp();
      std::ostream::write((char *)output_stream,
                          (long)((sequence_to_write->
                                 super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                                 super__Vector_impl_data._M_start + (uint)write_point));
      iVar3 = std::ostream::tellp();
      iVar3 = iVar3 - iVar2;
      iVar2 = iVar3 + 7;
      if (-1 < iVar3) {
        iVar2 = iVar3;
      }
      *actual_write_size = iVar2 >> 3;
    }
    bVar4 = ((byte)output_stream[*(long *)(*(long *)output_stream + -0x18) + 0x20] & 5) == 0;
  }
  return bVar4;
}

Assistant:

bool WriteStream(int write_point, int write_size,
                 const std::vector<T>& sequence_to_write,
                 std::ostream* output_stream, int* actual_write_size) {
  if (write_point < 0 || write_size <= 0 || NULL == output_stream) {
    return false;
  }

  const int end(write_point + write_size);
  if (sequence_to_write.size() < static_cast<std::size_t>(end)) {
    return false;
  }

  const int before((NULL == actual_write_size)
                       ? 0
                       : static_cast<int>(output_stream->tellp()));

  output_stream->write(
      reinterpret_cast<const char*>(&(sequence_to_write[0]) + write_point),
      sizeof(sequence_to_write[0]) * write_size);

  // When output_stream is cout, actual_write_size is always zero.
  if (NULL != actual_write_size) {
    const int after(static_cast<int>(output_stream->tellp()));
    const int type_byte(sizeof(sequence_to_write[0]));
    *actual_write_size = (after - before) / type_byte;
  }

  return !output_stream->fail();
}